

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O2

void get_set_srv(void)

{
  char cVar1;
  ostream *poVar2;
  io_service *piVar3;
  runtime_error *prVar4;
  stream_socket s2;
  io_service srv;
  stream_socket s1;
  ostringstream oss;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Test get/set io_service");
  std::endl<char,std::char_traits<char>>(poVar2);
  booster::aio::io_service::io_service(&srv);
  booster::aio::stream_socket::stream_socket(&s1,&srv);
  cVar1 = booster::aio::basic_io_device::has_io_service();
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x115);
    std::operator<<(poVar2," s1.has_io_service()");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&s2);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar3 = (io_service *)booster::aio::basic_io_device::get_io_service();
  if (piVar3 == &srv) {
    booster::aio::basic_io_device::reset_io_service();
    cVar1 = booster::aio::basic_io_device::has_io_service();
    if (cVar1 != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x118);
      std::operator<<(poVar2," !s1.has_io_service()");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&s2);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::aio::basic_io_device::get_io_service();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x119);
    std::operator<<(poVar2," !\"Shoud throw\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&s2);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x116);
  std::operator<<(poVar2," &s1.get_io_service() == &srv");
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,(string *)&s2);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void get_set_srv()
{
	std::cout << "Test get/set io_service" << std::endl;
	io::io_service srv;
	io::stream_socket s1(srv);
	TEST(s1.has_io_service());
	TEST(&s1.get_io_service() == &srv);
	s1.reset_io_service();
	TEST(!s1.has_io_service());
	try {s1.get_io_service(); TEST(!"Shoud throw"); }
	catch(sys::system_error const &e) {}
	io::stream_socket s2;
	TEST(!s2.has_io_service());
	try {s2.get_io_service(); TEST(!"Shoud throw"); }
	catch(sys::system_error const &e) {}
	s1.set_io_service(srv);
	s2.set_io_service(srv);
	TEST(&s1.get_io_service() == &srv);
	TEST(&s2.get_io_service() == &srv);
}